

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

float nk_layout_ratio_from_pixel(nk_context *ctx,float pixel_width)

{
  nk_window *pnVar1;
  float local_34;
  float local_30;
  float local_2c;
  nk_window *win;
  float pixel_width_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4534,"float nk_layout_ratio_from_pixel(struct nk_context *, float)");
  }
  if ((pixel_width == 0.0) && (!NAN(pixel_width))) {
    __assert_fail("pixel_width",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4535,"float nk_layout_ratio_from_pixel(struct nk_context *, float)");
  }
  if ((ctx == (nk_context *)0x0) ||
     ((ctx->current == (nk_window *)0x0 || (ctx->current->layout == (nk_panel *)0x0)))) {
    ctx_local._4_4_ = 0.0;
  }
  else {
    pnVar1 = ctx->current;
    if (1.0 <= pixel_width / (pnVar1->bounds).x) {
      local_2c = 1.0;
    }
    else {
      local_2c = pixel_width / (pnVar1->bounds).x;
    }
    if (0.0 <= local_2c) {
      if (1.0 <= pixel_width / (pnVar1->bounds).x) {
        local_34 = 1.0;
      }
      else {
        local_34 = pixel_width / (pnVar1->bounds).x;
      }
      local_30 = local_34;
    }
    else {
      local_30 = 0.0;
    }
    ctx_local._4_4_ = local_30;
  }
  return ctx_local._4_4_;
}

Assistant:

NK_API float
nk_layout_ratio_from_pixel(struct nk_context *ctx, float pixel_width)
{
    struct nk_window *win;
    NK_ASSERT(ctx);
    NK_ASSERT(pixel_width);
    if (!ctx || !ctx->current || !ctx->current->layout) return 0;
    win = ctx->current;
    return NK_CLAMP(0.0f, pixel_width/win->bounds.x, 1.0f);
}